

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O0

bool __thiscall
libcellml::Importer::ImporterImpl::fetchModel
          (ImporterImpl *this,ImportSourcePtr *importSource,string *baseFile)

{
  IssueImpl *pIVar1;
  byte bVar2;
  bool bVar3;
  ReferenceRule RVar4;
  element_type *peVar5;
  size_type sVar6;
  element_type *peVar7;
  element_type *peVar8;
  streambuf *psVar9;
  string *input;
  element_type *peVar10;
  size_t sVar11;
  mapped_type *pmVar12;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Model>_>
  local_5c0;
  Logger local_590;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_580;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_560;
  undefined1 local_540 [8];
  IssuePtr issue_2;
  ulong local_520;
  size_t index;
  size_t errorCount;
  string local_500;
  undefined1 local_4e0 [8];
  IssuePtr issue_1;
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [8];
  ParserPtr parser;
  stringstream buffer;
  ostream local_480 [380];
  int local_304;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  undefined1 local_2c0 [8];
  IssuePtr issue;
  ifstream file;
  undefined1 local_a8 [8];
  ModelPtr model;
  string local_68;
  undefined1 local_48 [8];
  string url;
  string *baseFile_local;
  ImportSourcePtr *importSource_local;
  ImporterImpl *this_local;
  
  url.field_2._8_8_ = baseFile;
  peVar5 = std::
           __shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)importSource);
  ImportSource::url_abi_cxx11_(&local_68,peVar5);
  normaliseDirectorySeparator((string *)local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  sVar6 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Model>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Model>_>_>_>
          ::count(&this->mLibrary,(key_type *)local_48);
  if (sVar6 == 0) {
    resolvePath((string *)
                &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                (string *)local_48,(string *)url.field_2._8_8_);
    std::__cxx11::string::operator=
              ((string *)local_48,
               (string *)
               &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__cxx11::string::~string
              ((string *)
               &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  std::shared_ptr<libcellml::Model>::shared_ptr((shared_ptr<libcellml::Model> *)local_a8);
  sVar6 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Model>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Model>_>_>_>
          ::count(&this->mLibrary,(key_type *)local_48);
  if (sVar6 == 0) {
    std::ifstream::ifstream
              (&issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               local_48,8);
    bVar2 = std::ios::good();
    if ((bVar2 & 1) == 0) {
      Issue::IssueImpl::create();
      peVar7 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_2c0);
      pIVar1 = peVar7->mPimpl;
      std::operator+(&local_300,"The attempt to resolve imports with the model at \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
      std::operator+(&local_2e0,&local_300,"\' failed: the file could not be opened.");
      Issue::IssueImpl::setDescription(pIVar1,&local_2e0);
      std::__cxx11::string::~string((string *)&local_2e0);
      std::__cxx11::string::~string((string *)&local_300);
      peVar7 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_2c0);
      peVar8 = std::
               __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&peVar7->mPimpl->mItem);
      AnyCellmlElement::AnyCellmlElementImpl::setImportSource(peVar8->mPimpl,importSource);
      peVar7 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_2c0);
      Issue::IssueImpl::setReferenceRule(peVar7->mPimpl,IMPORTER_MISSING_FILE);
      Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)local_2c0);
      this_local._7_1_ = 0;
      local_304 = 1;
      std::shared_ptr<libcellml::Issue>::~shared_ptr((shared_ptr<libcellml::Issue> *)local_2c0);
    }
    else {
      std::__cxx11::stringstream::stringstream
                ((stringstream *)
                 &parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      psVar9 = (streambuf *)std::ifstream::rdbuf();
      std::ostream::operator<<(local_480,psVar9);
      bVar3 = Strict::isStrict(&this->mImporter->super_Strict);
      Parser::create((Parser *)local_4a0,bVar3);
      input = (string *)
              std::__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_4a0);
      std::__cxx11::stringstream::str();
      Parser::parseModel((Parser *)local_4b0,input);
      std::shared_ptr<libcellml::Model>::operator=
                ((shared_ptr<libcellml::Model> *)local_a8,(shared_ptr<libcellml::Model> *)local_4b0)
      ;
      std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_4b0);
      std::__cxx11::string::~string
                ((string *)
                 &issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      bVar3 = Strict::isStrict(&this->mImporter->super_Strict);
      if (!bVar3) {
        peVar10 = std::
                  __shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_4a0);
        sVar11 = Logger::messageCount(&peVar10->super_Logger);
        if (sVar11 != 0) {
          Issue::IssueImpl::create();
          peVar7 = std::
                   __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_4e0);
          pIVar1 = peVar7->mPimpl;
          peVar10 = std::
                    __shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)local_4a0);
          Logger::message((Logger *)&errorCount,(size_t)peVar10);
          peVar7 = std::
                   __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&errorCount);
          Issue::description_abi_cxx11_(&local_500,peVar7);
          Issue::IssueImpl::setDescription(pIVar1,&local_500);
          std::__cxx11::string::~string((string *)&local_500);
          std::shared_ptr<libcellml::Issue>::~shared_ptr
                    ((shared_ptr<libcellml::Issue> *)&errorCount);
          peVar7 = std::
                   __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_4e0);
          Issue::IssueImpl::setLevel(peVar7->mPimpl,MESSAGE);
          peVar7 = std::
                   __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_4e0);
          peVar8 = std::
                   __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&peVar7->mPimpl->mItem);
          AnyCellmlElement::AnyCellmlElementImpl::setImportSource(peVar8->mPimpl,importSource);
          Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)local_4e0);
          std::shared_ptr<libcellml::Issue>::~shared_ptr((shared_ptr<libcellml::Issue> *)local_4e0);
        }
      }
      peVar10 = std::
                __shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_4a0);
      sVar11 = Logger::errorCount(&peVar10->super_Logger);
      if (sVar11 != 0) {
        for (local_520 = 0; local_520 < sVar11; local_520 = local_520 + 1) {
          peVar10 = std::
                    __shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)local_4a0);
          Logger::error((Logger *)
                        &issue_2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount,(size_t)peVar10);
          peVar7 = std::
                   __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&issue_2.
                                  super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount);
          RVar4 = Issue::referenceRule(peVar7);
          std::shared_ptr<libcellml::Issue>::~shared_ptr
                    ((shared_ptr<libcellml::Issue> *)
                     &issue_2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          if (RVar4 == XML) {
            Issue::IssueImpl::create();
            peVar7 = std::
                     __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_540);
            pIVar1 = peVar7->mPimpl;
            std::operator+(&local_580,"The attempt to import the model at \'",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_48);
            std::operator+(&local_560,&local_580,"\' failed: the file is not valid XML.");
            Issue::IssueImpl::setDescription(pIVar1,&local_560);
            std::__cxx11::string::~string((string *)&local_560);
            std::__cxx11::string::~string((string *)&local_580);
            peVar7 = std::
                     __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_540);
            peVar8 = std::
                     __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&peVar7->mPimpl->mItem);
            AnyCellmlElement::AnyCellmlElementImpl::setImportSource(peVar8->mPimpl,importSource);
            bVar3 = Strict::isStrict(&this->mImporter->super_Strict);
            if (bVar3) {
              peVar7 = std::
                       __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)local_540);
              Issue::IssueImpl::setReferenceRule(peVar7->mPimpl,IMPORTER_NULL_MODEL);
            }
            Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)local_540);
            this_local._7_1_ = 0;
            local_304 = 1;
            std::shared_ptr<libcellml::Issue>::~shared_ptr
                      ((shared_ptr<libcellml::Issue> *)local_540);
            goto LAB_0030ecb1;
          }
          peVar10 = std::
                    __shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)local_4a0);
          Logger::error(&local_590,(size_t)peVar10);
          Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)&local_590);
          std::shared_ptr<libcellml::Issue>::~shared_ptr((shared_ptr<libcellml::Issue> *)&local_590)
          ;
        }
      }
      std::make_pair<std::__cxx11::string&,std::shared_ptr<libcellml::Model>&>
                (&local_5c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                 (shared_ptr<libcellml::Model> *)local_a8);
      std::
      map<std::__cxx11::string,std::shared_ptr<libcellml::Model>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<libcellml::Model>>>>
      ::insert<std::pair<std::__cxx11::string,std::shared_ptr<libcellml::Model>>>
                ((map<std::__cxx11::string,std::shared_ptr<libcellml::Model>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<libcellml::Model>>>>
                  *)&this->mLibrary,&local_5c0);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Model>_>
      ::~pair(&local_5c0);
      local_304 = 0;
LAB_0030ecb1:
      std::shared_ptr<libcellml::Parser>::~shared_ptr((shared_ptr<libcellml::Parser> *)local_4a0);
      std::__cxx11::stringstream::~stringstream
                ((stringstream *)
                 &parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    std::ifstream::~ifstream
              (&issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    if (local_304 != 0) goto LAB_0030ed7d;
  }
  else {
    pmVar12 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Model>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Model>_>_>_>
              ::operator[](&this->mLibrary,(key_type *)local_48);
    std::shared_ptr<libcellml::Model>::operator=((shared_ptr<libcellml::Model> *)local_a8,pmVar12);
  }
  peVar5 = std::
           __shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)importSource);
  ImportSource::setModel(peVar5,(ModelPtr *)local_a8);
  this_local._7_1_ = 1;
  local_304 = 1;
LAB_0030ed7d:
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_a8);
  std::__cxx11::string::~string((string *)local_48);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Importer::ImporterImpl::fetchModel(const ImportSourcePtr &importSource, const std::string &baseFile)
{
    std::string url = normaliseDirectorySeparator(importSource->url());
    if (mLibrary.count(url) == 0) {
        url = resolvePath(url, baseFile);
    }

    ModelPtr model;
    if (mLibrary.count(url) == 0) {
        // If the URL has not ever been resolved into a model in this library, with or
        // without baseFile, parse it and save.
        std::ifstream file(url);
        if (!file.good()) {
            auto issue = Issue::IssueImpl::create();
            issue->mPimpl->setDescription("The attempt to resolve imports with the model at '" + url + "' failed: the file could not be opened.");
            issue->mPimpl->mItem->mPimpl->setImportSource(importSource);
            issue->mPimpl->setReferenceRule(Issue::ReferenceRule::IMPORTER_MISSING_FILE);
            addIssue(issue);
            return false;
        }
        std::stringstream buffer;
        buffer << file.rdbuf();
        auto parser = Parser::create(mImporter->isStrict());
        model = parser->parseModel(buffer.str());
        if (!mImporter->isStrict() && (parser->messageCount() > 0)) {
            auto issue = Issue::IssueImpl::create();
            issue->mPimpl->setDescription(parser->message(0)->description());
            issue->mPimpl->setLevel(Issue::Level::MESSAGE);
            issue->mPimpl->mItem->mPimpl->setImportSource(importSource);
            addIssue(issue);
        }
        auto errorCount = parser->errorCount();
        if (errorCount > 0) {
            for (size_t index = 0; index < errorCount; ++index) {
                if (parser->error(index)->referenceRule() == Issue::ReferenceRule::XML) {
                    auto issue = Issue::IssueImpl::create();
                    issue->mPimpl->setDescription("The attempt to import the model at '" + url + "' failed: the file is not valid XML.");
                    issue->mPimpl->mItem->mPimpl->setImportSource(importSource);
                    if (mImporter->isStrict()) {
                        issue->mPimpl->setReferenceRule(Issue::ReferenceRule::IMPORTER_NULL_MODEL);
                    }
                    addIssue(issue);
                    return false;
                }
                addIssue(parser->error(index));
            }
        }
        mLibrary.insert(std::make_pair(url, model));
    } else {
        model = mLibrary[url];
    }
    importSource->setModel(model);
    return true;
}